

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZydisFuzzShared.c
# Opt level: O3

void ZydisValidateEnumRanges
               (ZydisDecodedInstruction *insn,ZydisDecodedOperand *operands,ZyanU8 operand_count)

{
  ZyanBool ZVar1;
  undefined2 uVar2;
  ushort uVar3;
  uint uVar4;
  ZydisInstructionCategory ZVar5;
  ZydisISASet ZVar6;
  ZydisISAExt ZVar7;
  ZydisBranchType ZVar8;
  ZydisExceptionClass ZVar9;
  ZydisMemoryOperandType ZVar10;
  ZydisSwizzleMode ZVar11;
  ZydisMaskMode ZVar12;
  ZydisBroadcastMode ZVar13;
  ZydisConversionMode ZVar14;
  ZydisRoundingMode ZVar15;
  ZydisOperandType ZVar16;
  ZydisRegister ZVar17;
  undefined3 uVar18;
  byte bVar19;
  ZyanStatus ZVar20;
  ZyanStatus ZVar21;
  int iVar22;
  ulong uVar23;
  long lVar24;
  ulong extraout_RAX;
  ZyanU64 ZVar25;
  undefined2 uVar26;
  ZydisDecodedInstruction *in_RCX;
  ZydisAccessedFlags *pZVar27;
  ulong uVar28;
  ulong uVar29;
  ZydisDecodedInstruction *instruction;
  ZydisDecodedOperand *operands_00;
  ZydisDecodedInstruction *unaff_RBX;
  long lVar30;
  ulong unaff_RBP;
  ZydisDecodedOperand *pZVar31;
  char *__format;
  ZydisDecodedInstruction *pZVar32;
  ZydisDecodedInstruction *instruction_00;
  ZydisDecodedInstruction *instruction_01;
  ZydisAccessedFlags *instruction_bytes;
  ZydisDecodedInstruction *unaff_R12;
  ZydisAccessedFlags *unaff_R13;
  ulong uVar33;
  bool bVar34;
  bool bVar35;
  ZyanU8 aZStack_6bf [15];
  ZyanUSize ZStack_6b0;
  ZyanUSize ZStack_6a8;
  undefined1 auStack_69f [15];
  ZydisDecodedInstruction ZStack_690;
  ZydisEncoderRequest ZStack_548;
  ZydisDecodedOperand aZStack_3b8 [10];
  ZydisDecodedInstruction *pZStack_98;
  ZydisDecodedInstruction *pZStack_90;
  ZydisDecodedOperand *pZStack_80;
  code *pcStack_78;
  ZydisDecodedInstruction *pZStack_70;
  ZydisAccessedFlags *pZStack_68;
  ZydisAccessedFlags *pZStack_60;
  ZydisDecodedInstruction *pZStack_58;
  ZydisDecodedInstruction *pZStack_50;
  
  pZVar31 = operands;
  if (insn->length < 0x10) {
    if (ZYDIS_MACHINE_MODE_MAX_VALUE < insn->machine_mode) goto LAB_0010f12b;
    if (ZYDIS_MNEMONIC_MAX_VALUE < insn->mnemonic) goto LAB_0010f130;
    if (ZYDIS_INSTRUCTION_ENCODING_MAX_VALUE < insn->encoding) goto LAB_0010f135;
    if (ZYDIS_OPCODE_MAP_MAX_VALUE < insn->opcode_map) goto LAB_0010f13a;
    if (operand_count != '\0') {
      unaff_R12 = (ZydisDecodedInstruction *)0x0;
      do {
        uVar4 = *(uint *)((long)&operands->type + (long)unaff_R12);
        if (4 < uVar4) goto LAB_0010f0b0;
        if (3 < *(uint *)((long)&operands->visibility + (long)unaff_R12)) goto LAB_0010f0b5;
        if (0x22 < *(uint *)((long)&operands->encoding + (long)unaff_R12)) goto LAB_0010f0bc;
        if (10 < *(uint *)((long)&operands->element_type + (long)unaff_R12)) goto LAB_0010f0c3;
        if (uVar4 == 4) {
          if (*(byte *)((long)&operands->field_10 + (long)unaff_R12) < 2) {
            if ((&(operands->field_10).imm.is_relative)[(long)unaff_R12] < 2) {
              ZydisValidateImmediateSize((ulong)(&(operands->field_10).imm.size)[(long)unaff_R12]);
              in_RCX = (ZydisDecodedInstruction *)(ulong)insn->length;
              if ((ZydisDecodedInstruction *)
                  ((ulong)((&(operands->field_10).imm.size)[(long)unaff_R12] >> 3) +
                  (ulong)(&(operands->field_10).mem.scale)[(long)unaff_R12]) <= in_RCX)
              goto LAB_0010ef8f;
              goto LAB_0010f0cf;
            }
            ZydisValidateEnumRanges_cold_1();
          }
          ZydisValidateEnumRanges_cold_2();
LAB_0010f0f2:
          ZydisValidateEnumRanges_cold_7();
LAB_0010f0f7:
          __format = 
          "Value op->mem.disp.offset + (op->mem.disp.size / 8) = 0x%016lX is above expected max insn->length = 0x%016lX\n"
          ;
          goto LAB_0010f108;
        }
        if (uVar4 == 2) {
          if (4 < *(uint *)((long)&operands->field_10 + (long)unaff_R12)) goto LAB_0010f0ca;
          if (*(uint *)((undefined1 *)((long)&operands->field_10 + 4) + (long)unaff_R12) < 0x10b) {
            if (*(uint *)((undefined1 *)((long)&operands->field_10 + 8) + (long)unaff_R12) < 0x10b)
            {
              if (*(uint *)((undefined1 *)((long)&operands->field_10 + 0xc) + (long)unaff_R12) <
                  0x10b) {
                ZydisValidateImmediateSize
                          ((ulong)(byte)((undefined1 *)((long)&operands->field_10 + 0x21))
                                        [(long)unaff_R12]);
                in_RCX = (ZydisDecodedInstruction *)(ulong)insn->length;
                if ((ZydisDecodedInstruction *)
                    ((ulong)((byte)((undefined1 *)((long)&operands->field_10 + 0x21))
                                   [(long)unaff_R12] >> 3) +
                    (ulong)(byte)((undefined1 *)((long)&operands->field_10 + 0x20))[(long)unaff_R12]
                    ) <= in_RCX) goto LAB_0010ef8f;
                goto LAB_0010f0f7;
              }
              ZydisValidateEnumRanges_cold_3();
            }
            ZydisValidateEnumRanges_cold_4();
          }
          ZydisValidateEnumRanges_cold_5();
          unaff_RBX = insn;
          goto LAB_0010f123;
        }
        if ((uVar4 == 1) && (0x10a < *(uint *)((long)&operands->field_10 + (long)unaff_R12)))
        goto LAB_0010f0f2;
LAB_0010ef8f:
        unaff_R12 = (ZydisDecodedInstruction *)&(unaff_R12->avx).swizzle;
      } while ((ZydisDecodedInstruction *)((ulong)operand_count * 0x50) != unaff_R12);
    }
    if (ZYDIS_MASK_MODE_CONTROL_ZEROING < (insn->avx).mask.mode) goto LAB_0010f13f;
    if (ZYDIS_REGISTER_IA32_KERNEL_GS_BASE < (insn->avx).mask.reg) goto LAB_0010f144;
    if (1 < (insn->avx).broadcast.is_static) goto LAB_0010f149;
    if (ZYDIS_BROADCAST_MODE_8_TO_16 < (insn->avx).broadcast.mode) goto LAB_0010f151;
    if (ZYDIS_ROUNDING_MODE_MAX_VALUE < (insn->avx).rounding.mode) goto LAB_0010f156;
    if (ZYDIS_SWIZZLE_MODE_DDDD < (insn->avx).swizzle.mode) goto LAB_0010f15b;
    if (ZYDIS_CONVERSION_MODE_MAX_VALUE < (insn->avx).conversion.mode) goto LAB_0010f160;
    if (1 < (insn->avx).has_sae) goto LAB_0010f165;
    bVar19 = (insn->avx).has_eviction_hint;
    uVar23 = (ulong)bVar19;
    if (1 < bVar19) goto LAB_0010f16d;
    ZVar5 = (insn->meta).category;
    instruction_01 = (ZydisDecodedInstruction *)(ulong)ZVar5;
    if (ZYDIS_CATEGORY_MAX_VALUE < ZVar5) goto LAB_0010f175;
    ZVar6 = (insn->meta).isa_set;
    instruction_01 = (ZydisDecodedInstruction *)(ulong)ZVar6;
    if (ZYDIS_ISA_SET_MAX_VALUE < ZVar6) goto LAB_0010f17a;
    ZVar7 = (insn->meta).isa_ext;
    instruction_01 = (ZydisDecodedInstruction *)(ulong)ZVar7;
    if (199 < ZVar7) goto LAB_0010f17f;
    ZVar8 = (insn->meta).branch_type;
    instruction_01 = (ZydisDecodedInstruction *)(ulong)ZVar8;
    if (ZYDIS_BRANCH_TYPE_FAR < ZVar8) goto LAB_0010f184;
    ZVar9 = (insn->meta).exception_class;
    instruction_01 = (ZydisDecodedInstruction *)(ulong)ZVar9;
    if (ZVar9 < (ZYDIS_EXCEPTION_CLASS_AMXE5|ZYDIS_EXCEPTION_CLASS_SSE2)) {
      lVar24 = 0;
      do {
        if (ZYDIS_PREFIX_TYPE_MANDATORY < (insn->raw).prefixes[lVar24].type) {
          ZydisValidateEnumRanges_cold_14();
          goto LAB_0010f0a0;
        }
        lVar24 = lVar24 + 1;
      } while (lVar24 != 0xf);
      lVar24 = 0;
      bVar35 = true;
      while ((insn->raw).imm[lVar24].is_signed < 2) {
        if (1 < (insn->raw).imm[lVar24].is_relative) goto LAB_0010f0a8;
        lVar24 = 1;
        bVar34 = !bVar35;
        bVar35 = false;
        if (bVar34) {
          return;
        }
      }
LAB_0010f0a0:
      ZydisValidateEnumRanges_cold_13();
LAB_0010f0a8:
      ZydisValidateEnumRanges_cold_12();
LAB_0010f0b0:
      ZydisValidateEnumRanges_cold_11();
LAB_0010f0b5:
      ZydisValidateEnumRanges_cold_10();
LAB_0010f0bc:
      ZydisValidateEnumRanges_cold_9();
LAB_0010f0c3:
      ZydisValidateEnumRanges_cold_8();
LAB_0010f0ca:
      ZydisValidateEnumRanges_cold_6();
LAB_0010f0cf:
      __format = 
      "Value op->imm.offset + (op->imm.size / 8) = 0x%016lX is above expected max insn->length = 0x%016lX\n"
      ;
LAB_0010f108:
      fprintf(_stderr,__format);
      abort();
    }
  }
  else {
LAB_0010f123:
    insn = unaff_RBX;
    ZydisValidateEnumRanges_cold_33();
LAB_0010f12b:
    ZydisValidateEnumRanges_cold_32();
LAB_0010f130:
    ZydisValidateEnumRanges_cold_31();
LAB_0010f135:
    ZydisValidateEnumRanges_cold_30();
LAB_0010f13a:
    ZydisValidateEnumRanges_cold_29();
LAB_0010f13f:
    ZydisValidateEnumRanges_cold_28();
LAB_0010f144:
    ZydisValidateEnumRanges_cold_27();
LAB_0010f149:
    ZydisValidateEnumRanges_cold_26();
LAB_0010f151:
    ZydisValidateEnumRanges_cold_25();
LAB_0010f156:
    ZydisValidateEnumRanges_cold_24();
LAB_0010f15b:
    ZydisValidateEnumRanges_cold_23();
LAB_0010f160:
    ZydisValidateEnumRanges_cold_22();
LAB_0010f165:
    ZydisValidateEnumRanges_cold_21();
    uVar23 = extraout_RAX;
LAB_0010f16d:
    instruction_01 = (ZydisDecodedInstruction *)(uVar23 & 0xff);
    ZydisValidateEnumRanges_cold_20();
LAB_0010f175:
    ZydisValidateEnumRanges_cold_19();
LAB_0010f17a:
    ZydisValidateEnumRanges_cold_18();
LAB_0010f17f:
    ZydisValidateEnumRanges_cold_17();
LAB_0010f184:
    ZydisValidateEnumRanges_cold_16();
  }
  ZydisValidateEnumRanges_cold_15();
  if (((((instruction_01->mnemonic == ZYDIS_MNEMONIC_XCHG) &&
        (instruction_01->operand_count == '\x02')) && (pZVar31->type == ZYDIS_OPERAND_TYPE_REGISTER)
       ) && ((pZVar31[1].type == ZYDIS_OPERAND_TYPE_REGISTER &&
             (ZVar10 = (pZVar31->field_10).mem.type, ZVar10 == pZVar31[1].field_10.mem.type)))) &&
     ((instruction->mnemonic == ZYDIS_MNEMONIC_NOP &&
      (((ZVar10 == 0x15 || (ZVar10 == 0x35)) ||
       ((ZVar10 == 0x25 && (instruction_01->machine_mode != ZYDIS_MACHINE_MODE_LONG_64)))))))) {
    return;
  }
  instruction_00 = (ZydisDecodedInstruction *)(ulong)instruction_01->machine_mode;
  ZVar11 = (instruction_01->avx).swizzle.mode;
  pZVar27 = (ZydisAccessedFlags *)(ulong)ZVar11;
  if (ZVar11 == ZYDIS_SWIZZLE_MODE_DCBA) {
    pZVar27 = (ZydisAccessedFlags *)0x0;
  }
  ZVar11 = (instruction->avx).swizzle.mode;
  instruction_bytes = (ZydisAccessedFlags *)(ulong)ZVar11;
  if (ZVar11 == ZYDIS_SWIZZLE_MODE_DCBA) {
    instruction_bytes = (ZydisAccessedFlags *)0x0;
  }
  pZStack_58 = insn;
  pZStack_50 = unaff_R12;
  if ((((instruction_01->machine_mode == instruction->machine_mode) &&
       (instruction_01->mnemonic == instruction->mnemonic)) &&
      (instruction_01->stack_width == instruction->stack_width)) &&
     (bVar19 = instruction_01->operand_count, bVar19 == instruction->operand_count)) {
    ZVar12 = (instruction_01->avx).mask.mode;
    instruction_00 = (ZydisDecodedInstruction *)(ulong)ZVar12;
    if (((ZVar12 == (instruction->avx).mask.mode) &&
        (ZVar1 = (instruction_01->avx).broadcast.is_static,
        instruction_00 = (ZydisDecodedInstruction *)(ulong)CONCAT31((int3)(ZVar12 >> 8),ZVar1),
        ZVar1 == (instruction->avx).broadcast.is_static)) &&
       ((ZVar13 = (instruction_01->avx).broadcast.mode,
        instruction_00 = (ZydisDecodedInstruction *)(ulong)ZVar13,
        ZVar13 == (instruction->avx).broadcast.mode &&
        (ZVar14 = (instruction_01->avx).conversion.mode,
        instruction_00 = (ZydisDecodedInstruction *)(ulong)ZVar14,
        ZVar14 == (instruction->avx).conversion.mode)))) {
      ZVar15 = (instruction_01->avx).rounding.mode;
      instruction_00 = (ZydisDecodedInstruction *)(ulong)ZVar15;
      if (ZVar15 == (instruction->avx).rounding.mode) {
        ZVar1 = (instruction_01->avx).has_sae;
        uVar18 = (undefined3)(ZVar15 >> 8);
        instruction_00 = (ZydisDecodedInstruction *)(ulong)CONCAT31(uVar18,ZVar1);
        if (((ZVar1 == (instruction->avx).has_sae) &&
            (ZVar1 = (instruction_01->avx).has_eviction_hint,
            instruction_00 = (ZydisDecodedInstruction *)(ulong)CONCAT31(uVar18,ZVar1),
            ZVar1 == (instruction->avx).has_eviction_hint)) &&
           ((int)pZVar27 == (int)instruction_bytes)) {
          if (bVar19 == 0) {
            return;
          }
          unaff_R13 = (ZydisAccessedFlags *)0x0;
          pZStack_70 = instruction_01;
          while( true ) {
            ZVar16 = pZVar31->type;
            instruction_00 = (ZydisDecodedInstruction *)(ulong)ZVar16;
            if (ZVar16 != *(ZydisOperandType *)&in_RCX->attributes) break;
            uVar2 = pZVar31->size;
            uVar26 = (undefined2)in_RCX->opcode_map;
            pZVar27 = (ZydisAccessedFlags *)(ulong)(ushort)uVar26;
            instruction_bytes =
                 (ZydisAccessedFlags *)
                 CONCAT71((int7)((ulong)instruction_bytes >> 8),
                          ZVar16 == ZYDIS_OPERAND_TYPE_IMMEDIATE || uVar2 == uVar26);
            if (ZVar16 != ZYDIS_OPERAND_TYPE_IMMEDIATE && uVar2 != uVar26) break;
            pZVar32 = (ZydisDecodedInstruction *)(ulong)(ZVar16 - ZYDIS_OPERAND_TYPE_REGISTER);
            instruction_00 = pZVar32;
            if (3 < ZVar16 - ZYDIS_OPERAND_TYPE_REGISTER) goto LAB_0010f4ac;
            instruction_00 =
                 (ZydisDecodedInstruction *)
                 ((long)&switchD_0010f2fc::switchdataD_001240bc +
                 (long)(int)(&switchD_0010f2fc::switchdataD_001240bc)[(long)pZVar32]);
            switch(pZVar32) {
            case (ZydisDecodedInstruction *)0x0:
              ZVar10 = (pZVar31->field_10).mem.type;
              pZVar27 = (ZydisAccessedFlags *)(ulong)ZVar10;
              if (ZVar10 != (((anon_union_40_4_4687af53_for_ZydisDecodedOperand__10 *)
                             &in_RCX->cpu_flags)->mem).type) goto LAB_0010f4a4;
              break;
            case (ZydisDecodedInstruction *)0x1:
              if (instruction->length <= instruction_01->length) {
                pcStack_78 = (code *)0x10f3b8;
                ZVar21 = ZydisCalcAbsoluteAddress(instruction_01,pZVar31,0,(ZyanU64 *)&pZStack_60);
                unaff_RBP = (ulong)ZVar21;
                pcStack_78 = (code *)0x10f3db;
                instruction_00 = in_RCX;
                ZVar20 = ZydisCalcAbsoluteAddress
                                   (instruction,(ZydisDecodedOperand *)in_RCX,
                                    (ulong)instruction_01->length - (ulong)instruction->length,
                                    (ZyanU64 *)&pZStack_68);
                bVar35 = (int)(ZVar20 | ZVar21) < 0;
                unaff_R12 = instruction;
                if ((bVar35) || (pZStack_60 == pZStack_68)) {
                  ZVar10 = (pZVar31->field_10).mem.type;
                  pZVar27 = (ZydisAccessedFlags *)(ulong)ZVar10;
                  if (((ZVar10 == (((anon_union_40_4_4687af53_for_ZydisDecodedOperand__10 *)
                                   &in_RCX->cpu_flags)->mem).type) &&
                      (((((pZVar31->field_10).mem.segment ==
                          (((anon_union_40_4_4687af53_for_ZydisDecodedOperand__10 *)
                           &in_RCX->cpu_flags)->mem).segment &&
                         ((pZVar31->field_10).mem.base == *(ZydisRegister *)&in_RCX->fpu_flags)) &&
                        ((pZVar31->field_10).mem.index ==
                         *(ZydisRegister *)((long)&in_RCX->fpu_flags + 4))) &&
                       ((ZVar10 == ZYDIS_MEMOP_TYPE_MIB ||
                        (bVar19 = (byte)(in_RCX->avx).vector_length,
                        pZVar27 = (ZydisAccessedFlags *)(ulong)bVar19,
                        (pZVar31->field_10).mem.scale == bVar19)))))) &&
                     (bVar34 = (pZVar31->field_10).mem.disp.value ==
                               *(long *)&(in_RCX->avx).mask.reg,
                     pZVar27 = (ZydisAccessedFlags *)(ulong)bVar34, !bVar35 || bVar34)) {
                    bVar19 = pZStack_70->operand_count;
                    instruction_01 = pZStack_70;
                    break;
                  }
                  goto LAB_0010f482;
                }
                goto LAB_0010f4b4;
              }
              goto LAB_0010f49f;
            case (ZydisDecodedInstruction *)0x2:
              uVar3 = (pZVar31->field_10).ptr.segment;
              pZVar27 = (ZydisAccessedFlags *)(ulong)uVar3;
              if ((uVar3 != (((anon_union_40_4_4687af53_for_ZydisDecodedOperand__10 *)
                             &in_RCX->cpu_flags)->ptr).segment) ||
                 (ZVar17 = (pZVar31->field_10).mem.segment,
                 pZVar27 = (ZydisAccessedFlags *)(ulong)ZVar17,
                 ZVar17 != (((anon_union_40_4_4687af53_for_ZydisDecodedOperand__10 *)
                            &in_RCX->cpu_flags)->mem).segment)) goto LAB_0010f48f;
              break;
            case (ZydisDecodedInstruction *)0x3:
              if ((((pZVar31->field_10).imm.is_relative !=
                    (((anon_union_40_4_4687af53_for_ZydisDecodedOperand__10 *)&in_RCX->cpu_flags)->
                    imm).is_relative) ||
                  ((pZVar31->field_10).imm.is_signed !=
                   (((anon_union_40_4_4687af53_for_ZydisDecodedOperand__10 *)&in_RCX->cpu_flags)->
                   imm).is_signed)) ||
                 ((ZydisAccessedFlags *)(pZVar31->field_10).imm.value.u != in_RCX->fpu_flags)) {
                ZVar5 = (instruction_01->meta).category;
                instruction_00 = (ZydisDecodedInstruction *)(ulong)ZVar5;
                if ((ZVar5 != ZYDIS_CATEGORY_LOGICAL) && (ZVar5 != ZYDIS_CATEGORY_DATAXFER))
                goto LAB_0010f497;
                if ((ushort)uVar26 < (ushort)uVar2) {
                  uVar26 = uVar2;
                }
                if ((ushort)uVar26 < 0x40) {
                  instruction_00 = (ZydisDecodedInstruction *)~(-1L << ((byte)uVar26 & 0x3f));
                  pZVar27 = (ZydisAccessedFlags *)
                            ((ulong)in_RCX->fpu_flags ^ (pZVar31->field_10).imm.value.u);
                  if (((ulong)pZVar27 & (ulong)instruction_00) != 0) goto LAB_0010f497;
                }
                else {
                  pZVar27 = (ZydisAccessedFlags *)(pZVar31->field_10).imm.value.u;
                  if (pZVar27 != in_RCX->fpu_flags) goto LAB_0010f497;
                }
              }
            }
            unaff_R13 = (ZydisAccessedFlags *)((long)&unaff_R13->tested + 1);
            pZVar27 = (ZydisAccessedFlags *)(ulong)bVar19;
            pZVar31 = pZVar31 + 1;
            in_RCX = (ZydisDecodedInstruction *)&(in_RCX->avx).swizzle;
            if (pZVar27 <= unaff_R13) {
              return;
            }
          }
          pcStack_78 = (code *)0x10f482;
          ZydisValidateInstructionIdentity_cold_2();
LAB_0010f482:
          pcStack_78 = (code *)0x10f48a;
          ZydisValidateInstructionIdentity_cold_6();
        }
      }
    }
  }
  pcStack_78 = (code *)0x10f48f;
  ZydisValidateInstructionIdentity_cold_1();
LAB_0010f48f:
  pcStack_78 = (code *)0x10f497;
  ZydisValidateInstructionIdentity_cold_4();
LAB_0010f497:
  pcStack_78 = (code *)0x10f49f;
  ZydisValidateInstructionIdentity_cold_3();
LAB_0010f49f:
  pcStack_78 = (code *)0x10f4a4;
  ZydisValidateInstructionIdentity_cold_7();
LAB_0010f4a4:
  pcStack_78 = (code *)0x10f4ac;
  ZydisValidateInstructionIdentity_cold_8();
LAB_0010f4ac:
  pcStack_78 = (code *)0x10f4b4;
  ZydisValidateInstructionIdentity_cold_9();
  pZStack_60 = pZVar27;
LAB_0010f4b4:
  bVar19 = (byte)pZStack_60;
  pcStack_78 = ZydisReEncodeInstruction;
  ZydisValidateInstructionIdentity_cold_5();
  pZStack_98 = in_RCX;
  pZStack_90 = unaff_R12;
  pZStack_80 = pZVar31;
  pcStack_78 = (code *)unaff_RBP;
  ZydisPrintInstruction(instruction_00,operands_00,bVar19,(ZyanU8 *)instruction_bytes);
  ZydisValidateEnumRanges(instruction_00,operands_00,bVar19);
  if (bVar19 < instruction_00->operand_count_visible) {
    __assert_fail("operand_count >= insn1->operand_count_visible",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/tools/ZydisFuzzShared.c"
                  ,0x1dd,
                  "void ZydisReEncodeInstruction(const ZydisDecoder *, const ZydisDecodedInstruction *, const ZydisDecodedOperand *, ZyanU8, const ZyanU8 *)"
                 );
  }
  ZVar21 = ZydisEncoderDecodedInstructionToEncoderRequest
                     (instruction_00,operands_00,instruction_00->operand_count_visible,&ZStack_548);
  if ((int)ZVar21 < 0) {
    ZydisReEncodeInstruction_cold_1();
LAB_0010f73b:
    ZydisReEncodeInstruction_cold_2();
LAB_0010f740:
    ZydisReEncodeInstruction_cold_3();
  }
  else {
    ZStack_6b0 = 0xf;
    ZVar21 = ZydisEncoderEncodeInstruction(&ZStack_548,aZStack_6bf,&ZStack_6b0);
    if ((int)ZVar21 < 0) goto LAB_0010f73b;
    ZVar21 = ZydisDecoderDecodeFull
                       ((ZydisDecoder *)unaff_R13,aZStack_6bf,ZStack_6b0,&ZStack_690,aZStack_3b8);
    if ((int)ZVar21 < 0) goto LAB_0010f740;
    ZydisPrintInstruction(&ZStack_690,aZStack_3b8,ZStack_690.operand_count_visible,aZStack_6bf);
    ZydisValidateEnumRanges(&ZStack_690,aZStack_3b8,ZStack_690.operand_count_visible);
    ZydisValidateInstructionIdentity(instruction_00,operands_00,&ZStack_690,aZStack_3b8);
    uVar23 = (ulong)ZStack_690.length;
    if (ZStack_690.length <= instruction_00->length) {
      lVar24 = 0x8000;
      if (ZStack_690.address_width == '\x10') {
LAB_0010f5ee:
        lVar30 = 0x8000;
        if (ZStack_690.operand_width != '\x10') {
          lVar30 = lVar24;
        }
        if (ZStack_690.machine_mode == ZYDIS_MACHINE_MODE_LONG_64) {
          lVar30 = lVar24;
        }
        uVar28 = (ulong)ZStack_548.operand_count;
        if (ZStack_548.operand_count == 0) {
          return;
        }
        bVar35 = true;
        uVar33 = 0;
LAB_0010f61c:
        uVar29 = uVar33 << 6 | 0x30;
        pZVar31 = aZStack_3b8 + uVar33;
        do {
          iVar22 = *(int *)((long)ZStack_548.operands + (uVar29 - 0x30));
          if (iVar22 == 2) {
            if (((pZVar31->field_10).mem.base & ~ZYDIS_REGISTER_AL) == ZYDIS_REGISTER_EIP) {
              lVar24 = 0x20;
              goto LAB_0010f681;
            }
          }
          else if ((iVar22 == 4) && ((pZVar31->field_10).imm.is_relative != '\0'))
          goto LAB_0010f67c;
          uVar33 = uVar33 + 1;
          uVar29 = uVar29 + 0x40;
          pZVar31 = pZVar31 + 1;
          if (uVar28 <= uVar33) {
            if (bVar35) {
              return;
            }
            goto LAB_0010f6bc;
          }
        } while( true );
      }
      if (ZStack_690.address_width == '@') {
        lVar24 = -0x8000000000000000;
        goto LAB_0010f5ee;
      }
      if (ZStack_690.address_width == ' ') {
        lVar24 = 0x80000000;
        goto LAB_0010f5ee;
      }
      goto LAB_0010f754;
    }
  }
  ZydisReEncodeInstruction_cold_7();
  goto LAB_0010f74a;
LAB_0010f67c:
  lVar24 = 0x38;
LAB_0010f681:
  ZVar21 = ZydisCalcAbsoluteAddress
                     (&ZStack_690,pZVar31,lVar30 - uVar23,
                      (ZyanU64 *)((long)ZStack_548.operands + uVar29 + lVar24 + -0x30));
  if ((int)ZVar21 < 0) goto LAB_0010f74f;
  uVar28 = (ulong)ZStack_548.operand_count;
  uVar33 = uVar33 + 1;
  bVar35 = false;
  if (uVar28 <= uVar33) goto LAB_0010f6bc;
  goto LAB_0010f61c;
LAB_0010f6bc:
  ZStack_6a8 = 0xf;
  ZVar21 = ZydisEncoderEncodeInstructionAbsolute
                     (&ZStack_548,auStack_69f,&ZStack_6a8,lVar30 - uVar23);
  if ((int)ZVar21 < 0) {
    ZydisReEncodeInstruction_cold_5();
    ZVar25 = ZydisGetVersion();
    if (ZVar25 != 0x4000000000000) {
      ZydisFuzzerInit_cold_1();
    }
    return;
  }
  if ((ZStack_6a8 == ZStack_690.length) &&
     (iVar22 = bcmp(auStack_69f,aZStack_6bf,ZStack_6a8), iVar22 == 0)) {
    return;
  }
LAB_0010f74a:
  ZydisReEncodeInstruction_cold_6();
LAB_0010f74f:
  ZydisReEncodeInstruction_cold_4();
LAB_0010f754:
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/tools/ZydisFuzzShared.c"
                ,0x196,
                "void ZydisReEncodeInstructionAbsolute(ZydisEncoderRequest *, const ZydisDecodedInstruction *, const ZydisDecodedOperand *, const ZyanU8 *)"
               );
}

Assistant:

void ZydisValidateEnumRanges(const ZydisDecodedInstruction* insn,
    const ZydisDecodedOperand* operands, ZyanU8 operand_count)
{
#   define ZYDIS_CHECK_ENUM(value, max)                                                            \
    if ((ZyanU64)(value) > (ZyanU64)(max))                                                         \
    {                                                                                              \
        fprintf(stderr, "Value " #value " = 0x%016" PRIX64 " is above expected max " #max          \
            " = 0x%016" PRIX64 "\n", (ZyanU64)(value), (ZyanU64)(max));                            \
        abort();                                                                                   \
    }
#   define ZYDIS_CHECK_MAX ZYDIS_CHECK_ENUM

    ZYDIS_CHECK_ENUM(insn->length, ZYDIS_MAX_INSTRUCTION_LENGTH);

    ZYDIS_CHECK_ENUM(insn->machine_mode, ZYDIS_MACHINE_MODE_MAX_VALUE);
    ZYDIS_CHECK_ENUM(insn->mnemonic, ZYDIS_MNEMONIC_MAX_VALUE);
    ZYDIS_CHECK_ENUM(insn->encoding, ZYDIS_INSTRUCTION_ENCODING_MAX_VALUE);
    ZYDIS_CHECK_ENUM(insn->opcode_map, ZYDIS_OPCODE_MAP_MAX_VALUE);
    ZYDIS_CHECK_ENUM(insn->opcode_map, ZYDIS_OPCODE_MAP_MAX_VALUE);

    // Operands.
    for (ZyanU32 i = 0; i < operand_count; ++i)
    {
        const ZydisDecodedOperand* op = &operands[i];
        ZYDIS_CHECK_ENUM(op->type, ZYDIS_OPERAND_TYPE_MAX_VALUE);
        ZYDIS_CHECK_ENUM(op->visibility, ZYDIS_OPERAND_VISIBILITY_MAX_VALUE);
        ZYDIS_CHECK_ENUM(op->encoding, ZYDIS_OPERAND_ENCODING_MAX_VALUE);
        ZYDIS_CHECK_ENUM(op->element_type, ZYDIS_ELEMENT_TYPE_MAX_VALUE);

        switch (op->type)
        {
        case ZYDIS_OPERAND_TYPE_REGISTER:
            ZYDIS_CHECK_ENUM(op->reg.value, ZYDIS_REGISTER_MAX_VALUE);
            break;
        case ZYDIS_OPERAND_TYPE_MEMORY:
            ZYDIS_CHECK_ENUM(op->mem.type, ZYDIS_MEMOP_TYPE_MAX_VALUE);
            ZYDIS_CHECK_ENUM(op->mem.segment, ZYDIS_REGISTER_MAX_VALUE);
            ZYDIS_CHECK_ENUM(op->mem.base, ZYDIS_REGISTER_MAX_VALUE);
            ZYDIS_CHECK_ENUM(op->mem.index, ZYDIS_REGISTER_MAX_VALUE);
            ZydisValidateImmediateSize(op->mem.disp.size);
            ZYDIS_CHECK_MAX(op->mem.disp.offset + (op->mem.disp.size / 8), insn->length);
            break;
        case ZYDIS_OPERAND_TYPE_IMMEDIATE:
            ZYDIS_CHECK_ENUM(op->imm.is_signed, ZYAN_TRUE);
            ZYDIS_CHECK_ENUM(op->imm.is_relative, ZYAN_TRUE);
            ZydisValidateImmediateSize(op->imm.size);
            ZYDIS_CHECK_MAX(op->imm.offset + (op->imm.size / 8), insn->length);
            break;
        default:
            break;
        }
    }

    // AVX.
    ZYDIS_CHECK_ENUM(insn->avx.mask.mode, ZYDIS_MASK_MODE_MAX_VALUE);
    ZYDIS_CHECK_ENUM(insn->avx.mask.reg, ZYDIS_REGISTER_MAX_VALUE);
    ZYDIS_CHECK_ENUM(insn->avx.broadcast.is_static, ZYAN_TRUE);
    ZYDIS_CHECK_ENUM(insn->avx.broadcast.mode, ZYDIS_BROADCAST_MODE_MAX_VALUE);
    ZYDIS_CHECK_ENUM(insn->avx.rounding.mode, ZYDIS_ROUNDING_MODE_MAX_VALUE);
    ZYDIS_CHECK_ENUM(insn->avx.swizzle.mode, ZYDIS_SWIZZLE_MODE_MAX_VALUE);
    ZYDIS_CHECK_ENUM(insn->avx.conversion.mode, ZYDIS_CONVERSION_MODE_MAX_VALUE);
    ZYDIS_CHECK_ENUM(insn->avx.has_sae, ZYAN_TRUE);
    ZYDIS_CHECK_ENUM(insn->avx.has_eviction_hint, ZYAN_TRUE);

    // Meta.
    ZYDIS_CHECK_ENUM(insn->meta.category, ZYDIS_CATEGORY_MAX_VALUE);
    ZYDIS_CHECK_ENUM(insn->meta.isa_set, ZYDIS_ISA_SET_MAX_VALUE);
    ZYDIS_CHECK_ENUM(insn->meta.isa_ext, ZYDIS_ISA_SET_MAX_VALUE);
    ZYDIS_CHECK_ENUM(insn->meta.branch_type, ZYDIS_BRANCH_TYPE_MAX_VALUE);
    ZYDIS_CHECK_ENUM(insn->meta.exception_class, ZYDIS_EXCEPTION_CLASS_MAX_VALUE);

    // Raw.
    for (ZyanU32 i = 0; i < ZYAN_ARRAY_LENGTH(insn->raw.prefixes); ++i)
    {
        ZYDIS_CHECK_ENUM(insn->raw.prefixes[i].type, ZYDIS_PREFIX_TYPE_MAX_VALUE);
    }
    for (ZyanU32 i = 0; i < ZYAN_ARRAY_LENGTH(insn->raw.imm); ++i)
    {
        ZYDIS_CHECK_ENUM(insn->raw.imm[i].is_signed, ZYAN_TRUE);
        ZYDIS_CHECK_ENUM(insn->raw.imm[i].is_relative, ZYAN_TRUE);
    }

#   undef ZYDIS_CHECK_ENUM
#   undef ZYDIS_CHECK_MAX
}